

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processAttributeDeclRef
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,XMLCh *refName,
          XMLCh *useAttr,XMLCh *defaultVal,XMLCh *fixedVal)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  short *psVar1;
  XMLCh XVar2;
  uint saveScope;
  DefAttTypes defType;
  XMLStringPool *pXVar3;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar4;
  RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *pRVar5;
  DatatypeValidator *pDVar6;
  XercesAttGroupInfo *pXVar7;
  QName *pQVar8;
  byte bVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SchemaAttDef *pSVar14;
  Grammar *pGVar15;
  ulong uVar16;
  DOMElement *elem_00;
  XMLCh *pXVar17;
  SchemaAttDef *pSVar18;
  SchemaInfo *toRestore_00;
  XMLCh *pXVar19;
  ListType aListType;
  XMLSize_t count;
  XMLCh XVar20;
  ulong uVar21;
  ulong uVar22;
  XMLCh *pXVar23;
  RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *pRVar24;
  bool bVar25;
  XMLCh *local_78;
  
  if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0 && typeInfo == (ComplexTypeInfo *)0x0)
  {
    return;
  }
  iVar12 = XMLString::indexOf(refName,L':');
  if (iVar12 + 1U < 2) {
    pXVar23 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,refName,(long)iVar12);
    pXVar3 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar13 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
    iVar12 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar13);
    pXVar23 = (XMLCh *)CONCAT44(extraout_var,iVar12);
  }
  iVar12 = XMLString::indexOf(refName,L':');
  count = 0;
  if (refName != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)refName + count);
      count = count + 2;
    } while (*psVar1 != 0);
    count = ((long)count >> 1) - 1;
  }
  if (count == (long)(iVar12 + 1)) {
    local_78 = L"";
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar12 == -1) {
      this_00->fIndex = 0;
      pXVar17 = refName;
    }
    else {
      count = count + ~(long)iVar12;
      this_00->fIndex = 0;
      pXVar17 = refName + (long)iVar12 + 1;
    }
    XMLBuffer::append(this_00,pXVar17,count);
    pXVar3 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar13 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3);
    iVar12 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[10])(pXVar3,(ulong)uVar13);
    local_78 = (XMLCh *)CONCAT44(extraout_var_00,iVar12);
  }
  pXVar23 = resolvePrefixToURI(this,elem,pXVar23);
  uVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fURIStringPool,pXVar23);
  if (((typeInfo != (ComplexTypeInfo *)0x0) &&
      (pSVar14 = RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::get
                           (typeInfo->fAttDefs,local_78,uVar13), pSVar14 != (SchemaAttDef *)0x0)) ||
     ((this->fCurrentAttGroupInfo != (XercesAttGroupInfo *)0x0 &&
      (bVar11 = XercesAttGroupInfo::containsAttribute(this->fCurrentAttGroupInfo,local_78,uVar13),
      bVar11)))) {
    iVar12 = 0x46;
    refName = pXVar23;
    goto LAB_00336da3;
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  pXVar17 = this->fTargetNSURIString;
  aListType = INCLUDE;
  if (pXVar23 == pXVar17) {
    pSVar14 = (SchemaAttDef *)0x0;
  }
  else {
    pXVar19 = pXVar23;
    if (pXVar17 == (XMLCh *)0x0 || pXVar23 == (XMLCh *)0x0) {
      if (pXVar23 == (XMLCh *)0x0) {
        if (pXVar17 != (XMLCh *)0x0) goto LAB_00336a0f;
      }
      else {
        bVar11 = *pXVar23 == L'\0';
        if ((pXVar17 != (XMLCh *)0x0) && (*pXVar23 == L'\0')) {
LAB_00336a0f:
          bVar11 = *pXVar17 == L'\0';
        }
        if (!bVar11) goto LAB_00336a31;
      }
      pSVar14 = (SchemaAttDef *)0x0;
      aListType = INCLUDE;
    }
    else {
      do {
        XVar20 = *pXVar19;
        if (XVar20 == L'\0') goto LAB_00336a0f;
        XVar2 = *pXVar17;
        pXVar17 = pXVar17 + 1;
        pXVar19 = pXVar19 + 1;
      } while (XVar20 == XVar2);
LAB_00336a31:
      iVar12 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,pXVar23);
      pVVar4 = this->fImportedNSList;
      if (pVVar4 == (ValueVectorOf<int> *)0x0) {
LAB_00336ad7:
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,pXVar23,
                          (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        aListType = INCLUDE;
        bVar11 = false;
        pSVar14 = (SchemaAttDef *)0x0;
      }
      else {
        uVar16 = pVVar4->fCurCount;
        bVar11 = uVar16 != 0;
        if (uVar16 == 0) {
LAB_00336a87:
          if (!bVar11) goto LAB_00336ad7;
        }
        else if (*pVVar4->fElemList != iVar12) {
          uVar21 = 0;
          do {
            uVar22 = uVar16;
            if (uVar16 - 1 == uVar21) break;
            uVar22 = uVar21 + 1;
            lVar10 = uVar21 + 1;
            uVar21 = uVar22;
          } while (pVVar4->fElemList[lVar10] != iVar12);
          bVar11 = uVar22 < uVar16;
          goto LAB_00336a87;
        }
        pGVar15 = GrammarResolver::getGrammar(this->fGrammarResolver,pXVar23);
        if ((pGVar15 == (Grammar *)0x0) ||
           (iVar12 = (*(pGVar15->super_XSerializable)._vptr_XSerializable[5])(pGVar15), iVar12 != 1)
           ) {
          pSVar18 = (SchemaAttDef *)0x0;
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,pXVar23,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          bVar11 = false;
        }
        else {
          pSVar18 = (SchemaAttDef *)
                    RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher>::get
                              ((RefHashTableOf<xercesc_4_0::XMLAttDef,_xercesc_4_0::StringHasher> *)
                               pGVar15[6].super_XSerializable._vptr_XSerializable,local_78);
          if (pSVar18 == (SchemaAttDef *)0x0) {
            toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,uVar13);
            if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
              bVar11 = false;
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x29,refName,
                                (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              aListType = INCLUDE;
            }
            else {
              restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
              aListType = IMPORT;
              bVar11 = true;
            }
            pSVar14 = (SchemaAttDef *)0x0;
            if (bVar11) {
              pSVar14 = pSVar18;
            }
            goto LAB_00336b4a;
          }
          bVar11 = true;
        }
        aListType = INCLUDE;
        pSVar14 = pSVar18;
      }
LAB_00336b4a:
      if (!bVar11) {
        return;
      }
    }
  }
  if (pSVar14 == (SchemaAttDef *)0x0) {
    pRVar5 = this->fAttributeDeclRegistry;
    if ((local_78 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*local_78, uVar16 == 0)) {
      uVar16 = 0;
    }
    else {
      XVar20 = local_78[1];
      if (XVar20 != L'\0') {
        pXVar23 = local_78 + 2;
        do {
          uVar16 = (ulong)(ushort)XVar20 + (uVar16 >> 0x18) + uVar16 * 0x26;
          XVar20 = *pXVar23;
          pXVar23 = pXVar23 + 1;
        } while (XVar20 != L'\0');
      }
      uVar16 = uVar16 % pRVar5->fHashModulus;
    }
    pRVar24 = pRVar5->fBucketList[uVar16];
    if (pRVar24 == (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
LAB_00336bf0:
      elem_00 = SchemaInfo::getTopLevelComponent
                          (*enclosingSchema,3,L"attribute",local_78,enclosingSchema);
      if (elem_00 != (DOMElement *)0x0) {
        traverseAttributeDecl(this,elem_00,(ComplexTypeInfo *)0x0,true);
      }
    }
    else {
      do {
        bVar11 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,local_78,pRVar24->fKey);
        if (bVar11) goto LAB_00336c25;
        pRVar24 = pRVar24->fNext;
      } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0);
      if (!bVar11) goto LAB_00336bf0;
    }
LAB_00336c25:
    pRVar5 = this->fAttributeDeclRegistry;
    if ((local_78 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*local_78, uVar16 == 0)) {
      uVar16 = 0;
    }
    else {
      XVar20 = local_78[1];
      if (XVar20 != L'\0') {
        pXVar23 = local_78 + 2;
        do {
          uVar16 = (ulong)(ushort)XVar20 + (uVar16 >> 0x18) + uVar16 * 0x26;
          XVar20 = *pXVar23;
          pXVar23 = pXVar23 + 1;
        } while (XVar20 != L'\0');
      }
      uVar16 = uVar16 % pRVar5->fHashModulus;
    }
    pRVar24 = pRVar5->fBucketList[uVar16];
    if (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
      do {
        bVar11 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,local_78,pRVar24->fKey);
        if (bVar11) goto LAB_00336caf;
        pRVar24 = pRVar24->fNext;
      } while (pRVar24 != (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0);
    }
    pRVar24 = (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0;
LAB_00336caf:
    if (pRVar24 == (RefHashTableBucketElem<xercesc_4_0::XMLAttDef> *)0x0) {
      pSVar14 = (SchemaAttDef *)0x0;
    }
    else {
      pSVar14 = (SchemaAttDef *)pRVar24->fData;
    }
  }
  if (*enclosingSchema != toRestore) {
    restoreSchemaInfo(this,toRestore,aListType,saveScope);
  }
  if (pSVar14 == (SchemaAttDef *)0x0) {
    iVar12 = 0x29;
  }
  else {
    defType = (pSVar14->super_XMLAttDef).fDefaultType;
    pXVar23 = (pSVar14->super_XMLAttDef).fValue;
    bVar9 = 1;
    if ((defType == Fixed) &&
       ((defaultVal != (XMLCh *)0x0 ||
        ((fixedVal != (XMLCh *)0x0 && (bVar11 = XMLString::equals(fixedVal,pXVar23), !bVar11)))))) {
      bVar9 = 0;
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x87,refName,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pDVar6 = pSVar14->fDatatypeValidator;
    if ((pDVar6 == (DatatypeValidator *)0x0) || (pDVar6->fType != ID)) {
LAB_00336e0c:
      bVar25 = true;
      bVar11 = true;
      if (useAttr != L"required") {
        pXVar17 = L"required";
        pXVar19 = useAttr;
        if (useAttr == (XMLCh *)0x0) {
LAB_00336e45:
          bVar11 = *pXVar17 == L'\0';
        }
        else {
          do {
            XVar20 = *pXVar19;
            if (XVar20 == L'\0') goto LAB_00336e45;
            XVar2 = *pXVar17;
            pXVar17 = pXVar17 + 1;
            pXVar19 = pXVar19 + 1;
          } while (XVar20 == XVar2);
          bVar11 = false;
        }
      }
      if (useAttr != L"prohibited") {
        pXVar17 = L"prohibited";
        if (useAttr == (XMLCh *)0x0) {
LAB_00336e84:
          bVar25 = *pXVar17 == L'\0';
        }
        else {
          do {
            XVar20 = *useAttr;
            if (XVar20 == L'\0') goto LAB_00336e84;
            useAttr = useAttr + 1;
            XVar2 = *pXVar17;
            pXVar17 = pXVar17 + 1;
          } while (XVar20 == XVar2);
          bVar25 = false;
        }
      }
      pQVar8 = pSVar14->fAttName;
      pSVar18 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
      SchemaAttDef::SchemaAttDef
                (pSVar18,pQVar8->fPrefix,pQVar8->fLocalPart,pQVar8->fURIId,pXVar23,
                 (pSVar14->super_XMLAttDef).fType,defType,(XMLCh *)0x0,
                 this->fGrammarPoolMemoryManager);
      pSVar18->fBaseAttDecl = pSVar14;
      pSVar18->fPSVIScope = SCP_GLOBAL;
      if (defType == Fixed) {
        if ((bool)(bVar9 & bVar11)) {
          (pSVar18->super_XMLAttDef).fDefaultType = Required_And_Fixed;
        }
      }
      else if (bVar25) {
        (pSVar18->super_XMLAttDef).fDefaultType = DefAttTypes_Max;
      }
      else {
        if (bVar11) {
          if (fixedVal == (XMLCh *)0x0) {
            (pSVar18->super_XMLAttDef).fDefaultType = Required;
            fixedVal = defaultVal;
          }
          else {
            (pSVar18->super_XMLAttDef).fDefaultType = Required_And_Fixed;
          }
        }
        else if (fixedVal == (XMLCh *)0x0) {
          if (defaultVal == (XMLCh *)0x0) {
            fixedVal = (XMLCh *)0x0;
          }
          else {
            (pSVar18->super_XMLAttDef).fDefaultType = DefAttTypes_Min;
            fixedVal = defaultVal;
          }
        }
        else {
          (pSVar18->super_XMLAttDef).fDefaultType = Fixed;
        }
        if (fixedVal != (XMLCh *)0x0) {
          if (pDVar6 != (DatatypeValidator *)0x0) {
            if (pDVar6->fType == ID) {
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x88,refName,
                                (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            else {
              (*(pDVar6->super_XSerializable)._vptr_XSerializable[8])
                        (pDVar6,fixedVal,this->fSchemaInfo->fValidationContext,this->fMemoryManager)
              ;
            }
          }
          XMLAttDef::setValue((XMLAttDef *)pSVar18,fixedVal);
        }
      }
      pSVar18->fDatatypeValidator = pDVar6;
      if (typeInfo != (ComplexTypeInfo *)0x0) {
        ComplexTypeInfo::addAttDef(typeInfo,pSVar18);
      }
      if (this->fCurrentAttGroupInfo == (XercesAttGroupInfo *)0x0) {
        return;
      }
      XercesAttGroupInfo::addAttDef
                (this->fCurrentAttGroupInfo,pSVar18,typeInfo != (ComplexTypeInfo *)0x0);
      return;
    }
    pXVar7 = this->fCurrentAttGroupInfo;
    if (pXVar7 == (XercesAttGroupInfo *)0x0) {
      if (typeInfo->fAttWithTypeId != true) {
        typeInfo->fAttWithTypeId = true;
        goto LAB_00336e0c;
      }
      iVar12 = 0x89;
    }
    else {
      if (pXVar7->fTypeWithId != true) {
        pXVar7->fTypeWithId = true;
        goto LAB_00336e0c;
      }
      iVar12 = 0x8a;
    }
  }
  local_78 = (XMLCh *)0x0;
LAB_00336da3:
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar12,refName,local_78,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  return;
}

Assistant:

void TraverseSchema::processAttributeDeclRef(const DOMElement* const elem,
                                             ComplexTypeInfo* const typeInfo,
                                             const XMLCh* const refName,
                                             const XMLCh* const useAttr,
                                             const XMLCh* const defaultVal,
                                             const XMLCh* const fixedVal) {

    if (!typeInfo && !fCurrentAttGroupInfo) {
        return;
    }

    const XMLCh* prefix = getPrefix(refName);
    const XMLCh* localPart = getLocalPart(refName);
    const XMLCh* uriStr = resolvePrefixToURI(elem, prefix);
    unsigned int attURI = fURIStringPool->addOrFind(uriStr);

    // Check for duplicate references
    if (typeInfo && typeInfo->getAttDef(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }
    else if (fCurrentAttGroupInfo && fCurrentAttGroupInfo->containsAttribute(localPart, attURI)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateRefAttribute, uriStr, localPart);
        return;
    }

    // check for different namespace
    SchemaInfo* saveInfo = fSchemaInfo;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaAttDef* refAttDef = 0;
    unsigned int saveScope = fCurrentScope;

    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return;
        }

        refAttDef = (SchemaAttDef*) ((SchemaGrammar*) grammar)->getAttributeDeclRegistry()->get(localPart);

        if (!refAttDef) {

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(attURI);

            if (!impInfo || impInfo->getProcessed()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
                return;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    // if Global attribute registry does not contain the ref attribute, get
    // the referred attribute declaration and traverse it.
    if (!refAttDef) {

        if (fAttributeDeclRegistry->containsKey(localPart) == false) {

            DOMElement* referredAttribute = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Attribute,
                SchemaSymbols::fgELT_ATTRIBUTE, localPart, &fSchemaInfo);

            if (referredAttribute != 0) {
                traverseAttributeDecl(referredAttribute, 0, true);
            }
        }

        refAttDef = (SchemaAttDef*) fAttributeDeclRegistry->get(localPart);
    }

    // restore schema information, if necessary
    if (fSchemaInfo != saveInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    if (!refAttDef) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelAttributeNotFound, refName);
        return;
    }

    XMLAttDef::DefAttTypes refAttDefType = refAttDef->getDefaultType();
    const XMLCh* refAttValue = refAttDef->getValue();
    bool invalidAttUse = false;

    if (refAttDefType == XMLAttDef::Fixed &&
        (defaultVal || (fixedVal && !XMLString::equals(fixedVal, refAttValue)))) {

        invalidAttUse = true;
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttUseCorrect, refName);
    }

    DatatypeValidator* attDV = refAttDef->getDatatypeValidator();

    //check for multiple attributes with type derived from ID
    if (attDV && attDV->getType() == DatatypeValidator::ID) {

        if (fCurrentAttGroupInfo) {

            if (fCurrentAttGroupInfo->containsTypeWithId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttGrpPropCorrect3, refName);
                return;
            }

            fCurrentAttGroupInfo->setTypeWithId(true);
        }
        else {

            if (typeInfo->containsAttWithTypeId()) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect5, refName);
                return;
            }

            typeInfo->setAttWithTypeId(true);
        }
    }

    bool required = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_REQUIRED);
    bool prohibited = XMLString::equals(useAttr,SchemaSymbols::fgATTVAL_PROHIBITED);
    QName* attQName = refAttDef->getAttName();
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(attQName->getPrefix(),
                                            attQName->getLocalPart(),
                                            attQName->getURI(),
                                            refAttValue,
                                            refAttDef->getType(),
                                            refAttDefType,
                                            0, fGrammarPoolMemoryManager);

    attDef->setBaseAttDecl(refAttDef);
    attDef->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    if (refAttDefType == XMLAttDef::Fixed) {
        if (required && !invalidAttUse) {
            attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
        }
    }
    else {

        if (prohibited) {
            attDef->setDefaultType(XMLAttDef::Prohibited);
        }
        else {

            const XMLCh* valueConstraint = defaultVal;

            if (required){

                if (fixedVal) {

                    attDef->setDefaultType(XMLAttDef::Required_And_Fixed);
                    valueConstraint = fixedVal;
                }
                else {
                    attDef->setDefaultType(XMLAttDef::Required);
                }
            }
            else
            {
                if (fixedVal) {
                    attDef->setDefaultType(XMLAttDef::Fixed);
                    valueConstraint = fixedVal;
                }
                else if (defaultVal) {
                    attDef->setDefaultType(XMLAttDef::Default);
                }
            }

            if (valueConstraint) {

                // validate content of value constraint
                if (attDV) {

                    if (attDV->getType() == DatatypeValidator::ID) {
                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AttDeclPropCorrect3, refName);
                    }
                    else {
                        try {
                            attDV->validate(valueConstraint
                                          , fSchemaInfo->getValidationContext()
                                          , fMemoryManager);
                        }
                        catch(const XMLException& excep) {
                            reportSchemaError(elem, excep);
                        }
                        catch(const OutOfMemoryException&)
                        {
                            throw;
                        }
                        catch (...) {
                            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::DatatypeValidationFailure, valueConstraint);
                        }
                    }
                }

                attDef->setValue(valueConstraint);
            }
        }
    }

    attDef->setDatatypeValidator(attDV);

    bool toClone = false;

    if (typeInfo) {

        toClone = true;
        typeInfo->addAttDef(attDef);
    }

    if (fCurrentAttGroupInfo) {
        fCurrentAttGroupInfo->addAttDef(attDef, toClone);
    }
}